

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshba.cpp
# Opt level: O0

int select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,timeval *__timeout)

{
  int iVar1;
  reference pvVar2;
  ostream *poVar3;
  char *__command;
  size_type sVar4;
  size_type sVar5;
  __cxx11 local_e8 [48];
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [8];
  string cmd;
  value_type *x;
  int key;
  
  while( true ) {
    iVar1 = getKey();
    if ((iVar1 == 10) || (iVar1 == 0xd)) break;
    if (iVar1 == config.upKey) {
      iVar1 = currentIndex + -1;
      sVar4 = std::vector<Host,_std::allocator<Host>_>::size(&hosts);
      currentIndex = iVar1 % (int)sVar4;
    }
    else {
      if (iVar1 != config.downKey) {
        exit(0);
      }
      iVar1 = currentIndex + 1;
      sVar4 = std::vector<Host,_std::allocator<Host>_>::size(&hosts);
      currentIndex = iVar1 % (int)sVar4;
    }
    iVar1 = currentIndex;
    sVar4 = std::vector<Host,_std::allocator<Host>_>::size(&hosts);
    sVar5 = std::vector<Host,_std::allocator<Host>_>::size(&hosts);
    currentIndex = (iVar1 + (int)sVar4) % (int)sVar5;
    display();
  }
  pvVar2 = std::vector<Host,_std::allocator<Host>_>::operator[](&hosts,(long)currentIndex);
  std::operator+((char *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"ssh ");
  std::operator+(local_98,(char *)local_b8);
  std::operator+(local_78,local_98);
  std::operator+(local_58,(char *)local_78);
  std::__cxx11::to_string(local_e8,pvVar2->port);
  std::operator+(local_38,local_58);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_b8);
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"> ");
  poVar3 = std::operator<<(poVar3,(string *)local_38);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __command = (char *)std::__cxx11::string::c_str();
  system(__command);
  exit(0);
}

Assistant:

void select() {
    int key;
    while (true) {
        key = getKey();
        if (key == '\n' || key == '\r') {
            const auto &x = hosts[currentIndex];
            std::string cmd = "ssh " + x.userName + "@" + x.address + " -p" + std::to_string(x.port);
            std::cout << std::endl << "> " << cmd << std::endl;
            system(cmd.c_str());
            exit(0);
        } else if (key == config.upKey) {
            currentIndex = (currentIndex - 1) % int(hosts.size());
        } else if (key == config.downKey) {
            currentIndex = (currentIndex + 1) % int(hosts.size());
        } else {
            exit(0);
        }
        currentIndex = (currentIndex + int(hosts.size())) % int(hosts.size());
        display();
    }
}